

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,string cond,Type type,string m_key_name,string description,
          vector<RPCResult,_std::allocator<RPCResult>_> inner)

{
  long *plVar1;
  pointer pRVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  string cond_00;
  string m_key_name_00;
  string description_00;
  long *in_RCX;
  bool in_DL;
  undefined4 in_register_00000034;
  long *plVar8;
  long *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 *puVar9;
  long lVar10;
  long in_stack_ffffffffffffff90;
  pointer pRVar11;
  pointer local_58;
  long lStack_50;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  long local_28;
  
  plVar8 = (long *)CONCAT44(in_register_00000034,type);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = plVar8 + 2;
  if ((long *)*plVar8 == plVar1) {
    local_38 = *plVar1;
    lStack_30 = plVar8[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar1;
    local_48 = (long *)*plVar8;
  }
  local_40 = plVar8[1];
  *plVar8 = (long)plVar1;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pRVar2 = (pointer)(in_RCX + 2);
  if ((pointer)*in_RCX == pRVar2) {
    local_58 = *(pointer *)pRVar2;
    lStack_50 = in_RCX[3];
    pRVar11 = (pointer)&local_58;
  }
  else {
    local_58 = *(pointer *)pRVar2;
    pRVar11 = (pointer)*in_RCX;
  }
  lVar3 = in_RCX[1];
  *in_RCX = (long)pRVar2;
  in_RCX[1] = 0;
  *(undefined1 *)(in_RCX + 2) = 0;
  plVar1 = in_R8 + 2;
  if ((long *)*in_R8 == plVar1) {
    lVar10 = *plVar1;
    in_stack_ffffffffffffff90 = in_R8[3];
    puVar9 = &stack0xffffffffffffff88;
  }
  else {
    lVar10 = *plVar1;
    puVar9 = (undefined1 *)*in_R8;
  }
  lVar4 = in_R8[1];
  *in_R8 = (long)plVar1;
  in_R8[1] = 0;
  *(undefined1 *)(in_R8 + 2) = 0;
  uVar6 = *in_R9;
  uVar7 = in_R9[1];
  uVar5 = in_R9[2];
  in_R9[2] = 0;
  *in_R9 = 0;
  in_R9[1] = 0;
  cond_00._M_string_length = in_stack_ffffffffffffff50;
  cond_00._M_dataplus._M_p = &stack0xffffffffffffff58;
  cond_00.field_2._M_allocated_capacity = uVar6;
  cond_00.field_2._8_8_ = uVar7;
  m_key_name_00._M_string_length = in_stack_ffffffffffffff70;
  m_key_name_00._M_dataplus._M_p = (pointer)uVar5;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)puVar9;
  m_key_name_00.field_2._8_8_ = lVar4;
  description_00._M_string_length = in_stack_ffffffffffffff90;
  description_00._M_dataplus._M_p = (pointer)lVar10;
  description_00.field_2._M_allocated_capacity = (size_type)pRVar11;
  description_00.field_2._8_8_ = lVar3;
  RPCResult(this,cond_00,(Type)&local_48,m_key_name_00,in_DL,description_00,
            (vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff58);
  if (puVar9 != &stack0xffffffffffffff88) {
    operator_delete(puVar9,lVar10 + 1);
  }
  if (pRVar11 != (pointer)&local_58) {
    operator_delete(pRVar11,(ulong)((long)&local_58->m_type + 1));
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        std::string cond,
        Type type,
        std::string m_key_name,
        std::string description,
        std::vector<RPCResult> inner = {})
        : RPCResult{std::move(cond), type, std::move(m_key_name), /*optional=*/false, std::move(description), std::move(inner)} {}